

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int MMDB_vget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,__va_list_tag *va_path)

{
  uint uVar1;
  size_t sVar2;
  char **path_00;
  long *local_60;
  int status;
  char **path;
  int i;
  char *path_elem;
  size_t length;
  __va_list_tag *va_path_local;
  MMDB_entry_data_s *entry_data_local;
  MMDB_entry_s *start_local;
  
  sVar2 = path_length(va_path);
  path._4_4_ = 0;
  if (sVar2 == 0xffffffffffffffff) {
    start_local._4_4_ = 3;
  }
  else {
    path_00 = (char **)calloc(sVar2 + 1,8);
    if (path_00 == (char **)0x0) {
      start_local._4_4_ = 5;
    }
    else {
      while( true ) {
        uVar1 = va_path->gp_offset;
        if (uVar1 < 0x29) {
          local_60 = (long *)((long)(int)uVar1 + (long)va_path->reg_save_area);
          va_path->gp_offset = uVar1 + 8;
        }
        else {
          local_60 = (long *)va_path->overflow_arg_area;
          va_path->overflow_arg_area = local_60 + 1;
        }
        if ((char *)*local_60 == (char *)0x0) break;
        path_00[path._4_4_] = (char *)*local_60;
        path._4_4_ = path._4_4_ + 1;
      }
      path_00[path._4_4_] = (char *)0x0;
      start_local._4_4_ = MMDB_aget_value(start,entry_data,path_00);
      free(path_00);
    }
  }
  return start_local._4_4_;
}

Assistant:

int MMDB_vget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    va_list va_path) {
    size_t length = path_length(va_path);
    const char *path_elem;
    int i = 0;

    if (length == SIZE_MAX) {
        return MMDB_INVALID_METADATA_ERROR;
    }

    const char **path = calloc(length + 1, sizeof(const char *));
    if (NULL == path) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    while (NULL != (path_elem = va_arg(va_path, char *))) {
        path[i] = path_elem;
        i++;
    }
    path[i] = NULL;

    int status = MMDB_aget_value(start, entry_data, path);

    free(path);

    return status;
}